

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::InternalSwap
          (RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing> *this,
          RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing> *other)

{
  RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing> *other_local;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }